

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContextProfiler.cpp
# Opt level: O0

ULONG __thiscall Js::ScriptContextProfiler::Release(ScriptContextProfiler *this)

{
  Profiler *pPVar1;
  ULONG UVar2;
  Profiler *pPVar3;
  ULONG count;
  ScriptContextProfiler *this_local;
  
  UVar2 = this->refcount - 1;
  this->refcount = UVar2;
  if (UVar2 == 0) {
    if (this->recycler != (Recycler *)0x0) {
      pPVar1 = this->profiler;
      pPVar3 = Memory::Recycler::GetProfiler(this->recycler);
      if (pPVar1 == pPVar3) {
        Memory::Recycler::SetProfiler(this->recycler,(Profiler *)0x0,(Profiler *)0x0);
      }
    }
    Memory::
    DeleteObject<Memory::NoCheckHeapAllocator,(Memory::AllocatorDeleteFlags)0,Js::ScriptContextProfiler>
              ((AllocatorType *)&Memory::NoCheckHeapAllocator::Instance,this);
  }
  return UVar2;
}

Assistant:

ULONG
    ScriptContextProfiler::Release()
    {
        ULONG count = --refcount;
        if (count == 0)
        {
            if (recycler != nullptr && this->profiler == recycler->GetProfiler())
            {
                recycler->SetProfiler(nullptr, nullptr);
            }
            NoCheckHeapDelete(this);
        }
        return count;
    }